

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ZlibWriter.cpp
# Opt level: O2

bool __thiscall ZlibWriter::flush(ZlibWriter *this)

{
  uint uVar1;
  uint8_t *__x;
  int iVar2;
  ulong uVar3;
  bool bVar4;
  bool bVar5;
  uint8_t zchunk [16384];
  
  bVar4 = true;
  if (this->zbuf_changed == true) {
    (this->z).next_in = (Bytef *)0x0;
    (this->z).avail_in = 0;
    do {
      (this->z).next_out = zchunk;
      (this->z).avail_out = 0x4000;
      uVar1 = deflate(&this->z,4);
      bVar4 = uVar1 < 2;
      if (!bVar4) {
        return bVar4;
      }
      iVar2 = (this->z).avail_out - 0x4000;
      if (iVar2 != 0) {
        uVar3 = (ulong)(uint)-iVar2;
        std::vector<unsigned_char,_std::allocator<unsigned_char>_>::reserve
                  (&this->zbuf,
                   (size_type)
                   ((this->zbuf).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                    _M_impl.super__Vector_impl_data._M_finish +
                   (uVar3 - (long)(this->zbuf).
                                  super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                                  _M_impl.super__Vector_impl_data._M_start)));
        __x = zchunk;
        while (bVar5 = uVar3 != 0, uVar3 = uVar3 - 1, bVar5) {
          std::vector<unsigned_char,_std::allocator<unsigned_char>_>::push_back(&this->zbuf,__x);
          __x = __x + 1;
        }
      }
    } while (uVar1 != 1);
    this->zbuf_changed = false;
  }
  return bVar4;
}

Assistant:

bool ZlibWriter::flush() const
{
	if (!zbuf_changed)
	{
		return true;
	}

	int zresult;
	uint8_t zchunk[ZLIB_CHUNK_SIZE];

	z.next_in = Z_NULL;
	z.avail_in = 0;
	do
	{
		z.next_out = zchunk;
		z.avail_out = ZLIB_CHUNK_SIZE;

		zresult = deflate(&z, Z_FINISH);
		if (zresult != Z_OK && zresult != Z_STREAM_END)
		{
			return false;
		}

		size_t bytes_written = ZLIB_CHUNK_SIZE - z.avail_out;
		if (bytes_written != 0)
		{
			zbuf.reserve(zbuf.size() + bytes_written);
			for (size_t i = 0; i < bytes_written; i++)
			{
				zbuf.push_back(zchunk[i]);
			}
		}
	} while (zresult != Z_STREAM_END);

	zbuf_changed = false;
	return true;
}